

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Versions.cpp
# Opt level: O0

void __thiscall
glslang::TParseVersions::requireNotRemoved
          (TParseVersions *this,TSourceLoc *loc,int profileMask,int removedVersion,char *featureDesc
          )

{
  char *pcVar1;
  char local_68 [8];
  char buf [60];
  int maxSize;
  char *featureDesc_local;
  int removedVersion_local;
  int profileMask_local;
  TSourceLoc *loc_local;
  TParseVersions *this_local;
  
  if (((this->profile & profileMask) != EBadProfile) && (removedVersion <= this->version)) {
    buf[0x34] = '<';
    buf[0x35] = '\0';
    buf[0x36] = '\0';
    buf[0x37] = '\0';
    unique0x10000095 = featureDesc;
    pcVar1 = ProfileName(this->profile);
    snprintf(local_68,0x3c,"%s profile; removed in version %d",pcVar1,(ulong)(uint)removedVersion);
    (*this->_vptr_TParseVersions[0x2d])
              (this,loc,"no longer supported in",stack0xffffffffffffffd8,local_68);
  }
  return;
}

Assistant:

void TParseVersions::requireNotRemoved(const TSourceLoc& loc, int profileMask, int removedVersion, const char* featureDesc)
{
    if (profile & profileMask) {
        if (version >= removedVersion) {
            const int maxSize = 60;
            char buf[maxSize];
            snprintf(buf, maxSize, "%s profile; removed in version %d", ProfileName(profile), removedVersion);
            error(loc, "no longer supported in", featureDesc, buf);
        }
    }
}